

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkzb_c.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinPKZB_C>::eval_exc_polar_impl
               (double rho_a,double rho_b,double sigma_aa,double sigma_ab,double sigma_bb,
               double lapl_a,double lapl_b,double tau_a,double tau_b,double *eps)

{
  double dVar1;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM4_Qa;
  double in_XMM7_Qa;
  double in_stack_00000008;
  double t429;
  double t427;
  double t426;
  double t423;
  double t422;
  double t419;
  double t418;
  double t415;
  double t414;
  double t411;
  double t410;
  double t407;
  double t406;
  double t405;
  double t404;
  double t402;
  double t401;
  double t399;
  double t398;
  double t397;
  double t396;
  double t395;
  double t394;
  double t388;
  double t386;
  double t385;
  double t384;
  double t382;
  double t379;
  double t378;
  double t377;
  double t374;
  double t369;
  double t365;
  double t364;
  double t361;
  double t356;
  double t354;
  double t352;
  double t351;
  double t348;
  double t346;
  double t344;
  double t342;
  double t339;
  double t338;
  double t336;
  double t334;
  double t333;
  double t332;
  double t330;
  double t329;
  double t328;
  double t327;
  double t326;
  double t325;
  double t323;
  double t322;
  double t319;
  double t318;
  double t315;
  double t314;
  double t311;
  double t310;
  double t307;
  double t306;
  double t303;
  double t302;
  double t301;
  double t300;
  double t299;
  double t297;
  double t296;
  double t295;
  double t294;
  double t292;
  double t291;
  double t290;
  double t289;
  double t288;
  double t287;
  double t285;
  double t284;
  double t279;
  double t277;
  double t276;
  double t275;
  double t274;
  double t273;
  double t272;
  double t271;
  double t269;
  double t268;
  double t267;
  double t265;
  double t262;
  double t261;
  double t260;
  double t257;
  double t252;
  double t248;
  double t247;
  double t244;
  double t239;
  double t237;
  double t235;
  double t234;
  double t233;
  double t231;
  double t230;
  double t228;
  double t227;
  double t224;
  double t222;
  double t220;
  double t219;
  double t216;
  double t213;
  double t212;
  double t210;
  double t208;
  double t207;
  double t206;
  double t205;
  double t203;
  double t201;
  double t200;
  double t199;
  double t198;
  double t197;
  double t196;
  double t195;
  double t192;
  double t191;
  double t188;
  double t187;
  double t184;
  double t183;
  double t180;
  double t176;
  double t175;
  double t174;
  double t171;
  double t170;
  double t168;
  double t167;
  double t166;
  double t165;
  double t164;
  double t162;
  double t161;
  double t160;
  double t158;
  double t155;
  double t151;
  double t149;
  double t148;
  double t146;
  double t144;
  double t143;
  double t142;
  double t140;
  double t139;
  double t138;
  double t137;
  double t136;
  double t135;
  double t132;
  double t131;
  double t130;
  double t128;
  double t127;
  double t126;
  double t124;
  double t123;
  double t122;
  double t119;
  double t114;
  double t110;
  double t109;
  double t106;
  double t101;
  double t99;
  double t98;
  double t94;
  double t93;
  double t92;
  double t91;
  double t90;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t84;
  double t83;
  double t82;
  double t81;
  double t80;
  double t79;
  double t78;
  double t77;
  double t75;
  double t74;
  double t71;
  double t69;
  double t68;
  double t67;
  double t66;
  double t61;
  double t58;
  double t57;
  double t55;
  double t54;
  double t53;
  double t52;
  double t45;
  double t42;
  double t41;
  double t40;
  double t38;
  double t37;
  double t34;
  double t33;
  double t31;
  double t30;
  double t28;
  double t27;
  double t26;
  double t25;
  double t24;
  double t23;
  double t22;
  double t20;
  double t19;
  double t18;
  double t16;
  double t15;
  double t14;
  double t13;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t4;
  double t3;
  double t2;
  double t218;
  double t204;
  double t179;
  double t178;
  double t177;
  double t173;
  double t154;
  double t153;
  double t134;
  double t65;
  double t64;
  double t63;
  double t51;
  double t49;
  double t133;
  double t95;
  double t50;
  double t48;
  double t46;
  bool local_8e1;
  double x;
  bool local_8b1;
  
  dVar1 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  dVar2 = safe_math::cbrt<double>(1.16531558392231e-317);
  dVar3 = in_XMM0_Qa - in_XMM1_Qa;
  dVar4 = in_XMM0_Qa + in_XMM1_Qa;
  dVar5 = dVar3 * (1.0 / dVar4);
  dVar6 = dVar5 + 1.0;
  x = 0.5;
  dVar7 = safe_math::cbrt<double>(1.16546577987865e-317);
  dVar7 = dVar7 * dVar7 * dVar6 * 0.5;
  dVar8 = safe_math::cbrt<double>(1.16551419831194e-317);
  dVar5 = 1.0 - dVar5;
  dVar9 = dVar5 * x;
  dVar10 = safe_math::cbrt<double>(1.16559967166867e-317);
  dVar9 = dVar10 * dVar10 * dVar9;
  dVar10 = dVar7 * dVar1 * ((1.0 / (dVar2 * dVar2)) / (in_XMM0_Qa * in_XMM0_Qa)) +
           in_XMM4_Qa * ((1.0 / (dVar8 * dVar8)) / (in_XMM1_Qa * in_XMM1_Qa)) * dVar9;
  dVar7 = dVar7 * in_XMM7_Qa * ((1.0 / (dVar2 * dVar2)) / in_XMM0_Qa) +
          dVar9 * in_stack_00000008 * ((1.0 / (dVar8 * dVar8)) / in_XMM1_Qa);
  dVar8 = safe_math::cbrt<double>(1.1658220012093e-317);
  dVar9 = (1.0 / dVar8) * 2.519842099789747 * 0.9847450218426962;
  safe_math::sqrt<double>(1.16589512292488e-317);
  pow_3_2<double>(x);
  dVar11 = safe_math::log<double>(1.16604235448734e-317);
  dVar11 = (dVar9 * 0.053425 + 1.0) * 0.0621814 * dVar11;
  dVar2 = (double)(-(ulong)(dVar6 <= 1e-15) & 0x3ff0000000000000);
  dVar12 = safe_math::cbrt<double>(1.16616735309574e-317);
  dVar13 = dVar12 * 1e-15;
  dVar14 = safe_math::cbrt<double>(1.16619255044368e-317);
  dVar15 = piecewise_functor_3<double>((bool)(-(dVar2 != 0.0) & 1),dVar13,dVar14 * dVar6);
  dVar16 = (double)(-(ulong)(dVar5 <= 1e-15) & 0x3ff0000000000000);
  dVar17 = safe_math::cbrt<double>(1.1662671543562e-317);
  dVar18 = piecewise_functor_3<double>(dVar16 != 0.0,dVar13,dVar17 * dVar5);
  dVar15 = ((dVar15 + dVar18) - 2.0) * 1.9236610509315362;
  dVar18 = safe_math::log<double>(1.16645242897339e-317);
  dVar19 = safe_math::log<double>(1.16655321836514e-317);
  dVar19 = (dVar9 * 0.0278125 + 1.0) * dVar19;
  dVar20 = safe_math::log<double>(1.166659442479e-317);
  dVar20 = (1.0 - dVar20) * 0.10132118364233778;
  dVar21 = dVar12 * dVar12;
  dVar22 = piecewise_functor_3<double>(dVar2 != 0.0,dVar21,dVar14 * dVar14);
  dVar23 = piecewise_functor_3<double>(dVar16 != 0.0,dVar21,dVar17 * dVar17);
  dVar22 = dVar22 / 2.0 + dVar23 / 2.0;
  safe_math::exp<double>(1.16702356885998e-317);
  dVar23 = safe_math::log<double>(1.16729283463697e-317);
  local_8b1 = in_XMM0_Qa <= 1e-13 || dVar2 != 0.0;
  dVar8 = (1.0 / dVar8) * 1.2599210498948732;
  dVar14 = piecewise_functor_3<double>(dVar2 != 0.0,1.0 / dVar12,1.0 / dVar14);
  dVar14 = dVar8 * 2.4814019635975995 * dVar14;
  safe_math::sqrt<double>(1.1675625944796e-317);
  pow_3_2<double>(x);
  dVar24 = safe_math::log<double>(1.16769747440091e-317);
  dVar24 = (dVar14 * 0.053425 + 1.0) * 0.0621814 * dVar24;
  dVar25 = piecewise_functor_3<double>(false,dVar13,2.5198420997897464);
  dVar13 = piecewise_functor_3<double>(true,dVar13,0.0);
  dVar13 = ((dVar25 + dVar13) - 2.0) * 1.9236610509315362;
  dVar25 = safe_math::log<double>(1.16788670154327e-317);
  dVar26 = safe_math::log<double>(1.16798749093502e-317);
  dVar26 = (dVar14 * 0.0278125 + 1.0) * dVar26;
  dVar27 = piecewise_functor_3<double>(false,dVar21,1.5874010519681996);
  dVar21 = piecewise_functor_3<double>(true,dVar21,0.0);
  dVar21 = dVar27 / 2.0 + dVar21 / 2.0;
  dVar21 = dVar21 * dVar21 * dVar21;
  safe_math::exp<double>(1.16829479976673e-317);
  dVar27 = safe_math::log<double>(1.16861297804265e-317);
  dVar2 = piecewise_functor_3<double>(dVar2 != 0.0,1e-15,dVar6);
  dVar2 = piecewise_functor_3<double>
                    ((double)local_8b1 != 0.0,0.0,
                     ((dVar20 * dVar21 * dVar27 + -dVar24 +
                       dVar13 * (dVar26 * -0.0197516734986138 +
                                (dVar14 * 0.05137 + 1.0) * -0.0310907 * dVar25 + dVar24) +
                      dVar13 * 0.0197516734986138 * dVar26) * dVar2) / 2.0);
  local_8e1 = in_XMM1_Qa <= 1e-13 || dVar16 != 0.0;
  dVar6 = piecewise_functor_3<double>(dVar16 != 0.0,1.0 / dVar12,1.0 / dVar17);
  dVar6 = dVar8 * 2.4814019635975995 * dVar6;
  safe_math::sqrt<double>(1.16895388333829e-317);
  pow_3_2<double>(x);
  dVar8 = safe_math::log<double>(1.16907591755281e-317);
  dVar8 = (dVar6 * 0.053425 + 1.0) * 0.0621814 * dVar8;
  dVar12 = safe_math::log<double>(1.16919399924216e-317);
  dVar14 = safe_math::log<double>(1.16929478863392e-317);
  dVar14 = (dVar6 * 0.0278125 + 1.0) * dVar14;
  safe_math::exp<double>(1.16946524128173e-317);
  dVar17 = safe_math::log<double>(1.16973549519001e-317);
  dVar5 = piecewise_functor_3<double>(dVar16 != 0.0,1e-15,dVar5);
  dVar6 = piecewise_functor_3<double>
                    ((double)local_8e1 != 0.0,0.0,
                     ((dVar20 * dVar21 * dVar17 + -dVar8 +
                       dVar13 * (dVar14 * -0.0197516734986138 +
                                (dVar6 * 0.05137 + 1.0) * -0.0310907 * dVar12 + dVar8) +
                      dVar13 * 0.0197516734986138 * dVar14) * dVar5) / 2.0);
  *in_RDI = ((dVar10 * dVar10 * 0.00828125 * (1.0 / (dVar7 * dVar7)) + 1.0) *
             ((dVar20 * dVar22 * dVar22 * dVar22 * dVar23 +
               dVar3 * dVar3 * dVar3 * dVar3 * (1.0 / (dVar4 * dVar4 * dVar4 * dVar4)) *
               dVar15 * (dVar19 * -0.0197516734986138 +
                        (dVar9 * 0.05137 + 1.0) * -0.0310907 * dVar18 + dVar11) +
              dVar15 * 0.0197516734986138 * dVar19) - dVar11) -
            dVar1 * dVar1 * (1.0 / (in_XMM0_Qa * in_XMM0_Qa)) * 0.02390625 *
            (1.0 / (in_XMM7_Qa * in_XMM7_Qa)) * dVar2) -
            in_XMM4_Qa * in_XMM4_Qa * (1.0 / (in_XMM1_Qa * in_XMM1_Qa)) * 0.02390625 *
            (1.0 / (in_stack_00000008 * in_stack_00000008)) * dVar6;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_polar_impl( double rho_a, double rho_b, double sigma_aa, double sigma_ab, double sigma_bb, double lapl_a, double lapl_b, double tau_a, double tau_b, double& eps ) {

    (void)(lapl_a);
    (void)(lapl_b);
    (void)(eps);
    constexpr double t46 = constants::m_cbrt_3;
    constexpr double t48 = constants::m_cbrt_one_ov_pi;
    constexpr double t50 = constants::m_cbrt_4;
    constexpr double t95 = constants::m_cbrt_2;
    constexpr double t133 = constants::m_pi_sq;
    constexpr double t49 = t46 * t48;
    constexpr double t51 = t50 * t50;
    constexpr double t63 = t46 * t46;
    constexpr double t64 = t48 * t48;
    constexpr double t65 = t63 * t64;
    constexpr double t134 = 0.1e1 / t133;
    constexpr double t153 = 0.1e1 / t48;
    constexpr double t154 = t153 * t50;
    constexpr double t173 = t95 * t95;
    constexpr double t177 = 0.1e1 / t64;
    constexpr double t178 = t46 * t177;
    constexpr double t179 = t178 * t51;
    constexpr double t204 = t49 * t51;
    constexpr double t218 = t65 * t50;


    const double t2 = rho_a * rho_a;
    const double t3 = safe_math::cbrt( rho_a );
    const double t4 = t3 * t3;
    const double t6 = 0.1e1 / t4 / t2;
    const double t7 = sigma_aa * t6;
    const double t8 = rho_a - rho_b;
    const double t9 = rho_a + rho_b;
    const double t10 = 0.1e1 / t9;
    const double t11 = t8 * t10;
    const double t12 = 0.1e1 + t11;
    const double t13 = t12 / 0.2e1;
    const double t14 = safe_math::cbrt( t13 );
    const double t15 = t14 * t14;
    const double t16 = t15 * t13;
    const double t18 = rho_b * rho_b;
    const double t19 = safe_math::cbrt( rho_b );
    const double t20 = t19 * t19;
    const double t22 = 0.1e1 / t20 / t18;
    const double t23 = sigma_bb * t22;
    const double t24 = 0.1e1 - t11;
    const double t25 = t24 / 0.2e1;
    const double t26 = safe_math::cbrt( t25 );
    const double t27 = t26 * t26;
    const double t28 = t27 * t25;
    const double t30 = t16 * t7 + t23 * t28;
    const double t31 = t30 * t30;
    const double t33 = 0.1e1 / t4 / rho_a;
    const double t34 = tau_a * t33;
    const double t37 = 0.1e1 / t20 / rho_b;
    const double t38 = tau_b * t37;
    const double t40 = t16 * t34 + t28 * t38;
    const double t41 = t40 * t40;
    const double t42 = 0.1e1 / t41;
    const double t45 = 0.1e1 + 0.828125e-2 * t31 * t42;
    const double t52 = safe_math::cbrt( t9 );
    const double t53 = 0.1e1 / t52;
    const double t54 = t51 * t53;
    const double t55 = t49 * t54;
    const double t57 = 0.1e1 + 0.53425e-1 * t55;
    const double t58 = safe_math::sqrt( t55 );
    const double t61 = pow_3_2( t55 );
    const double t66 = t52 * t52;
    const double t67 = 0.1e1 / t66;
    const double t68 = t50 * t67;
    const double t69 = t65 * t68;
    const double t71 = 0.379785e1 * t58 + 0.8969e0 * t55 + 0.204775e0 * t61 + 0.123235e0 * t69;
    const double t74 = 0.1e1 + 0.16081979498692535067e2 / t71;
    const double t75 = safe_math::log( t74 );
    const double t77 = 0.621814e-1 * t57 * t75;
    const double t78 = t8 * t8;
    const double t79 = t78 * t78;
    const double t80 = t9 * t9;
    const double t81 = t80 * t80;
    const double t82 = 0.1e1 / t81;
    const double t83 = t79 * t82;
    const double t84 = t12 <= zeta_tol;
    const double t85 = safe_math::cbrt( zeta_tol );
    const double t86 = t85 * zeta_tol;
    const double t87 = safe_math::cbrt( t12 );
    const double t88 = t87 * t12;
    const double t89 = piecewise_functor_3( t84, t86, t88 );
    const double t90 = t24 <= zeta_tol;
    const double t91 = safe_math::cbrt( t24 );
    const double t92 = t91 * t24;
    const double t93 = piecewise_functor_3( t90, t86, t92 );
    const double t94 = t89 + t93 - 0.2e1;
    const double t98 = 0.1e1 / ( 0.2e1 * t95 - 0.2e1 );
    const double t99 = t94 * t98;
    const double t101 = 0.1e1 + 0.5137e-1 * t55;
    const double t106 = 0.705945e1 * t58 + 0.1549425e1 * t55 + 0.420775e0 * t61 + 0.1562925e0 * t69;
    const double t109 = 0.1e1 + 0.32163958997385070134e2 / t106;
    const double t110 = safe_math::log( t109 );
    const double t114 = 0.1e1 + 0.278125e-1 * t55;
    const double t119 = 0.51785e1 * t58 + 0.905775e0 * t55 + 0.1100325e0 * t61 + 0.1241775e0 * t69;
    const double t122 = 0.1e1 + 0.29608749977793437516e2 / t119;
    const double t123 = safe_math::log( t122 );
    const double t124 = t114 * t123;
    const double t126 = -0.310907e-1 * t101 * t110 + t77 - 0.19751673498613801407e-1 * t124;
    const double t127 = t99 * t126;
    const double t128 = t83 * t127;
    const double t130 = 0.19751673498613801407e-1 * t99 * t124;
    const double t131 = safe_math::log( 0.2e1 );
    const double t132 = 0.1e1 - t131;
    const double t135 = t132 * t134;
    const double t136 = t85 * t85;
    const double t137 = t87 * t87;
    const double t138 = piecewise_functor_3( t84, t136, t137 );
    const double t139 = t91 * t91;
    const double t140 = piecewise_functor_3( t90, t136, t139 );
    const double t142 = t138 / 0.2e1 + t140 / 0.2e1;
    const double t143 = t142 * t142;
    const double t144 = t143 * t142;
    const double t146 = sigma_aa + 0.2e1 * sigma_ab + sigma_bb;
    const double t148 = 0.1e1 / t52 / t80;
    const double t149 = t146 * t148;
    const double t151 = 0.1e1 / t143;
    const double t155 = t151 * t63 * t154;
    const double t158 = 0.1e1 / t132;
    const double t160 = ( -t77 + t128 + t130 ) * t158;
    const double t161 = 0.1e1 / t144;
    const double t162 = t133 * t161;
    const double t164 = safe_math::exp( -t160 * t162 );
    const double t165 = t164 - 0.1e1;
    const double t166 = 0.1e1 / t165;
    const double t167 = t158 * t166;
    const double t168 = t146 * t146;
    const double t170 = 0.1e1 / t66 / t81;
    const double t171 = t168 * t170;
    const double t174 = t143 * t143;
    const double t175 = 0.1e1 / t174;
    const double t176 = t173 * t175;
    const double t180 = t176 * t179;
    const double t183 = t149 * t95 * t155 / 0.96e2 + 0.21437009059034868486e-3 * t167 * t171 * t180;
    const double t184 = t183 * t158;
    const double t187 = 0.1e1 + 0.65854491829355115987e0 * t167 * t183;
    const double t188 = 0.1e1 / t187;
    const double t191 = 0.1e1 + 0.65854491829355115987e0 * t184 * t188;
    const double t192 = safe_math::log( t191 );
    const double t195 = t135 * t144 * t192 + t128 + t130 - t77;
    const double t196 = t45 * t195;
    const double t197 = sigma_aa * sigma_aa;
    const double t198 = 0.1e1 / t2;
    const double t199 = t197 * t198;
    const double t200 = tau_a * tau_a;
    const double t201 = 0.1e1 / t200;
    const double t203 = rho_a <= dens_tol || t84;
    const double t205 = t53 * t95;
    const double t206 = 0.1e1 / t85;
    const double t207 = 0.1e1 / t87;
    const double t208 = piecewise_functor_3( t84, t206, t207 );
    const double t210 = t204 * t205 * t208;
    const double t212 = 0.1e1 + 0.53425e-1 * t210;
    const double t213 = safe_math::sqrt( t210 );
    const double t216 = pow_3_2( t210 );
    const double t219 = t67 * t173;
    const double t220 = t208 * t208;
    const double t222 = t218 * t219 * t220;
    const double t224 = 0.379785e1 * t213 + 0.8969e0 * t210 + 0.204775e0 * t216 + 0.123235e0 * t222;
    const double t227 = 0.1e1 + 0.16081979498692535067e2 / t224;
    const double t228 = safe_math::log( t227 );
    const double t230 = 0.621814e-1 * t212 * t228;
    const double t231 = 0.2e1 <= zeta_tol;
    const double t233 = piecewise_functor_3( t231, t86, 0.2e1 * t95 );
    const double t234 = 0.e0 <= zeta_tol;
    const double t235 = piecewise_functor_3( t234, t86, 0.0 );
    const double t237 = ( t233 + t235 - 0.2e1 ) * t98;
    const double t239 = 0.1e1 + 0.5137e-1 * t210;
    const double t244 = 0.705945e1 * t213 + 0.1549425e1 * t210 + 0.420775e0 * t216 + 0.1562925e0 * t222;
    const double t247 = 0.1e1 + 0.32163958997385070134e2 / t244;
    const double t248 = safe_math::log( t247 );
    const double t252 = 0.1e1 + 0.278125e-1 * t210;
    const double t257 = 0.51785e1 * t213 + 0.905775e0 * t210 + 0.1100325e0 * t216 + 0.1241775e0 * t222;
    const double t260 = 0.1e1 + 0.29608749977793437516e2 / t257;
    const double t261 = safe_math::log( t260 );
    const double t262 = t252 * t261;
    const double t265 = t237 * ( -0.310907e-1 * t239 * t248 + t230 - 0.19751673498613801407e-1 * t262 );
    const double t267 = 0.19751673498613801407e-1 * t237 * t262;
    const double t268 = piecewise_functor_3( t231, t136, t173 );
    const double t269 = piecewise_functor_3( t234, t136, 0.0 );
    const double t271 = t268 / 0.2e1 + t269 / 0.2e1;
    const double t272 = t271 * t271;
    const double t273 = t272 * t271;
    const double t274 = 0.1e1 / t272;
    const double t275 = t274 * t63;
    const double t276 = t7 * t275;
    const double t277 = 0.1e1 / t208;
    const double t279 = t154 * t52 * t277;
    const double t284 = 0.1e1 / t273;
    const double t285 = t133 * t284;
    const double t287 = safe_math::exp( -( -t230 + t265 + t267 ) * t158 * t285 );
    const double t288 = t287 - 0.1e1;
    const double t289 = 0.1e1 / t288;
    const double t290 = t158 * t289;
    const double t291 = t2 * t2;
    const double t292 = t291 * rho_a;
    const double t294 = 0.1e1 / t3 / t292;
    const double t295 = t197 * t294;
    const double t296 = t272 * t272;
    const double t297 = 0.1e1 / t296;
    const double t299 = t290 * t295 * t297;
    const double t300 = t51 * t66;
    const double t301 = 0.1e1 / t220;
    const double t302 = t300 * t301;
    const double t303 = t178 * t302;
    const double t306 = t276 * t279 / 0.96e2 + 0.21437009059034868486e-3 * t299 * t303;
    const double t307 = t306 * t158;
    const double t310 = 0.1e1 + 0.65854491829355115987e0 * t290 * t306;
    const double t311 = 0.1e1 / t310;
    const double t314 = 0.1e1 + 0.65854491829355115987e0 * t307 * t311;
    const double t315 = safe_math::log( t314 );
    const double t318 = t135 * t273 * t315 - t230 + t265 + t267;
    const double t319 = piecewise_functor_3( t84, zeta_tol, t12 );
    const double t322 = piecewise_functor_3( t203, 0.0, t318 * t319 / 0.2e1 );
    const double t323 = t201 * t322;
    const double t325 = 0.2390625e-1 * t199 * t323;
    const double t326 = sigma_bb * sigma_bb;
    const double t327 = 0.1e1 / t18;
    const double t328 = t326 * t327;
    const double t329 = tau_b * tau_b;
    const double t330 = 0.1e1 / t329;
    const double t332 = rho_b <= dens_tol || t90;
    const double t333 = 0.1e1 / t91;
    const double t334 = piecewise_functor_3( t90, t206, t333 );
    const double t336 = t204 * t205 * t334;
    const double t338 = 0.1e1 + 0.53425e-1 * t336;
    const double t339 = safe_math::sqrt( t336 );
    const double t342 = pow_3_2( t336 );
    const double t344 = t334 * t334;
    const double t346 = t218 * t219 * t344;
    const double t348 = 0.379785e1 * t339 + 0.8969e0 * t336 + 0.204775e0 * t342 + 0.123235e0 * t346;
    const double t351 = 0.1e1 + 0.16081979498692535067e2 / t348;
    const double t352 = safe_math::log( t351 );
    const double t354 = 0.621814e-1 * t338 * t352;
    const double t356 = 0.1e1 + 0.5137e-1 * t336;
    const double t361 = 0.705945e1 * t339 + 0.1549425e1 * t336 + 0.420775e0 * t342 + 0.1562925e0 * t346;
    const double t364 = 0.1e1 + 0.32163958997385070134e2 / t361;
    const double t365 = safe_math::log( t364 );
    const double t369 = 0.1e1 + 0.278125e-1 * t336;
    const double t374 = 0.51785e1 * t339 + 0.905775e0 * t336 + 0.1100325e0 * t342 + 0.1241775e0 * t346;
    const double t377 = 0.1e1 + 0.29608749977793437516e2 / t374;
    const double t378 = safe_math::log( t377 );
    const double t379 = t369 * t378;
    const double t382 = t237 * ( -0.310907e-1 * t356 * t365 + t354 - 0.19751673498613801407e-1 * t379 );
    const double t384 = 0.19751673498613801407e-1 * t237 * t379;
    const double t385 = t23 * t275;
    const double t386 = 0.1e1 / t334;
    const double t388 = t154 * t52 * t386;
    const double t394 = safe_math::exp( -( -t354 + t382 + t384 ) * t158 * t285 );
    const double t395 = t394 - 0.1e1;
    const double t396 = 0.1e1 / t395;
    const double t397 = t158 * t396;
    const double t398 = t18 * t18;
    const double t399 = t398 * rho_b;
    const double t401 = 0.1e1 / t19 / t399;
    const double t402 = t326 * t401;
    const double t404 = t397 * t402 * t297;
    const double t405 = 0.1e1 / t344;
    const double t406 = t300 * t405;
    const double t407 = t178 * t406;
    const double t410 = t385 * t388 / 0.96e2 + 0.21437009059034868486e-3 * t404 * t407;
    const double t411 = t410 * t158;
    const double t414 = 0.1e1 + 0.65854491829355115987e0 * t397 * t410;
    const double t415 = 0.1e1 / t414;
    const double t418 = 0.1e1 + 0.65854491829355115987e0 * t411 * t415;
    const double t419 = safe_math::log( t418 );
    const double t422 = t135 * t273 * t419 - t354 + t382 + t384;
    const double t423 = piecewise_functor_3( t90, zeta_tol, t24 );
    const double t426 = piecewise_functor_3( t332, 0.0, t422 * t423 / 0.2e1 );
    const double t427 = t330 * t426;
    const double t429 = 0.2390625e-1 * t328 * t427;


    eps = t196 - t325 - t429;

  }